

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

void ResortStates(lemon *lemp)

{
  int iVar1;
  int iVar2;
  int iVar3;
  state **ppsVar4;
  state *psVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  action *ap;
  
  iVar1 = lemp->nstate;
  ppsVar4 = lemp->sorted;
  if (0 < (long)iVar1) {
    iVar2 = lemp->nrule;
    lVar12 = 0;
    do {
      psVar5 = ppsVar4[lVar12];
      psVar5->iDfltReduce = iVar2;
      psVar5->nTknAct = 0;
      psVar5->nNtAct = 0;
      psVar5->iTknOfst = -0x7fffffff;
      psVar5->iNtOfst = -0x7fffffff;
      ap = psVar5->ap;
      if (ap != (action *)0x0) {
        iVar11 = 0;
        iVar10 = 0;
        do {
          iVar6 = compute_action(lemp,ap);
          if (-1 < iVar6) {
            iVar3 = ap->sp->index;
            if (iVar3 < lemp->nterminal) {
              iVar11 = iVar11 + 1;
              psVar5->nTknAct = iVar11;
            }
            else if (iVar3 < lemp->nsymbol) {
              iVar10 = iVar10 + 1;
              psVar5->nNtAct = iVar10;
            }
            else {
              if ((psVar5->autoReduce != 0) && (psVar5->pDfltReduce != (rule *)(ap->x).stp)) {
                __assert_fail("stp->autoReduce==0 || stp->pDfltReduce==ap->x.rp",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/tools/lemon/lemon.c"
                              ,0x1264,"void ResortStates(struct lemon *)");
              }
              psVar5->iDfltReduce = iVar6 - (iVar1 + iVar2);
            }
          }
          ap = ap->next;
        } while (ap != (action *)0x0);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != iVar1);
  }
  qsort(ppsVar4 + 1,(long)(iVar1 + -1),8,stateResortCompare);
  uVar7 = lemp->nstate;
  uVar8 = (ulong)uVar7;
  if (0 < (int)uVar7) {
    ppsVar4 = lemp->sorted;
    uVar9 = 0;
    do {
      ppsVar4[uVar9]->statenum = (int)uVar9;
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
    if (uVar7 != 1) {
      do {
        uVar7 = (uint)uVar8;
        if (lemp->sorted[uVar8 - 1]->autoReduce == 0) goto LAB_00108550;
        uVar8 = (ulong)(uVar7 - 1);
      } while (2 < (int)uVar7);
      uVar7 = 1;
    }
  }
LAB_00108550:
  lemp->nxstate = uVar7;
  return;
}

Assistant:

void ResortStates(struct lemon *lemp)
{
  int i;
  struct state *stp;
  struct action *ap;

  for(i=0; i<lemp->nstate; i++){
    stp = lemp->sorted[i];
    stp->nTknAct = stp->nNtAct = 0;
    stp->iDfltReduce = lemp->nrule;  /* Init dflt action to "syntax error" */
    stp->iTknOfst = NO_OFFSET;
    stp->iNtOfst = NO_OFFSET;
    for(ap=stp->ap; ap; ap=ap->next){
      int iAction = compute_action(lemp,ap);
      if( iAction>=0 ){
        if( ap->sp->index<lemp->nterminal ){
          stp->nTknAct++;
        }else if( ap->sp->index<lemp->nsymbol ){
          stp->nNtAct++;
        }else{
          assert( stp->autoReduce==0 || stp->pDfltReduce==ap->x.rp );
          stp->iDfltReduce = iAction - lemp->nstate - lemp->nrule;
        }
      }
    }
  }
  qsort(&lemp->sorted[1], lemp->nstate-1, sizeof(lemp->sorted[0]),
        stateResortCompare);
  for(i=0; i<lemp->nstate; i++){
    lemp->sorted[i]->statenum = i;
  }
  lemp->nxstate = lemp->nstate;
  while( lemp->nxstate>1 && lemp->sorted[lemp->nxstate-1]->autoReduce ){
    lemp->nxstate--;
  }
}